

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2r2rect.cc
# Opt level: O0

bool __thiscall S2R2Rect::Contains(S2R2Rect *this,S2Point *p)

{
  int iVar1;
  double x;
  double y;
  Vector2<double> local_40;
  double local_30;
  double v;
  double u;
  S2Point *p_local;
  S2R2Rect *this_local;
  
  u = (double)p;
  p_local = (S2Point *)this;
  iVar1 = S2::GetFace(p);
  if (iVar1 == 0) {
    S2::ValidFaceXYZtoUV(0,(S2Point *)u,&v,&local_30);
    x = S2::UVtoST(v);
    y = S2::UVtoST(local_30);
    Vector2<double>::Vector2(&local_40,x,y);
    this_local._7_1_ = Contains(this,&local_40);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool S2R2Rect::Contains(const S2Point& p) const {
  if (S2::GetFace(p) != 0) return false;
  double u, v;
  S2::ValidFaceXYZtoUV(0, p, &u, &v);
  return Contains(R2Point(S2::UVtoST(u), S2::UVtoST(v)));
}